

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Address __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::getFinalAddress<wasm::AtomicWait>
          (ModuleRunnerBase<wasm::ModuleRunner> *this,AtomicWait *curr,Literal *ptr,Index bytes,
          Address memorySize)

{
  uintptr_t uVar1;
  uint64_t rhs;
  size_t lhs;
  uint64_t lhs_00;
  
  uVar1 = (ptr->type).id;
  if (uVar1 == 3) {
    lhs = (ptr->field_0).func.super_IString.str._M_len;
  }
  else {
    if (uVar1 != 2) {
      __assert_fail("type == Type::i64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                    ,0x121,"int64_t wasm::Literal::geti64() const");
    }
    lhs = (size_t)(ptr->field_0).i32;
  }
  rhs = memorySize.addr * 0x10000;
  trapIfGt(this,(curr->offset).addr,rhs,"offset > memory");
  trapIfGt(this,lhs,rhs - (curr->offset).addr,"final > memory");
  lhs_00 = lhs + (curr->offset).addr;
  trapIfGt(this,(ulong)bytes,rhs,"bytes > memory");
  trapIfGt(this,lhs_00,rhs - bytes,"highest > memory");
  return (Address)lhs_00;
}

Assistant:

Address
  getFinalAddress(LS* curr, Literal ptr, Index bytes, Address memorySize) {
    Address memorySizeBytes = memorySize * Memory::kPageSize;
    uint64_t addr = ptr.type == Type::i32 ? ptr.geti32() : ptr.geti64();
    trapIfGt(curr->offset, memorySizeBytes, "offset > memory");
    trapIfGt(addr, memorySizeBytes - curr->offset, "final > memory");
    addr += curr->offset;
    trapIfGt(bytes, memorySizeBytes, "bytes > memory");
    checkLoadAddress(addr, bytes, memorySize);
    return addr;
  }